

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

Vec_Vec_t * Saig_ManCexMinComputeReason(Aig_Man_t *pAig,Abc_Cex_t *pCex,int fPiReason)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Vec_t *vFrameCis;
  Vec_Vec_t *vFramePPs;
  Vec_Vec_t *pVVar4;
  long lVar5;
  
  if (pCex->nPis != pAig->nTruePis) {
    __assert_fail("pCex->nPis == Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d4,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->nRegs == pAig->nRegs) {
    if ((-1 < pCex->iPo) && (pCex->iPo < pAig->nTruePos)) {
      vFrameCis = Saig_ManCexMinCollectFrameTerms(pAig,pCex);
      vFramePPs = Saig_ManCexMinCollectPhasePriority(pAig,pCex,vFrameCis);
      pVVar4 = Saig_ManCexMinCollectReason(pAig,pCex,vFrameCis,vFramePPs,fPiReason);
      iVar1 = vFramePPs->nSize;
      if (0 < (long)iVar1) {
        ppvVar2 = vFramePPs->pArray;
        lVar5 = 0;
        do {
          pvVar3 = ppvVar2[lVar5];
          if (pvVar3 != (void *)0x0) {
            if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar3 + 8));
              *(undefined8 *)((long)pvVar3 + 8) = 0;
            }
            free(pvVar3);
          }
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      if (vFramePPs->pArray != (void **)0x0) {
        free(vFramePPs->pArray);
        vFramePPs->pArray = (void **)0x0;
      }
      if (vFramePPs != (Vec_Vec_t *)0x0) {
        free(vFramePPs);
      }
      iVar1 = vFrameCis->nSize;
      if (0 < (long)iVar1) {
        ppvVar2 = vFrameCis->pArray;
        lVar5 = 0;
        do {
          pvVar3 = ppvVar2[lVar5];
          if (pvVar3 != (void *)0x0) {
            if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar3 + 8));
              *(undefined8 *)((long)pvVar3 + 8) = 0;
            }
            free(pvVar3);
          }
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      if (vFrameCis->pArray != (void **)0x0) {
        free(vFrameCis->pArray);
        vFrameCis->pArray = (void **)0x0;
      }
      if (vFrameCis != (Vec_Vec_t *)0x0) {
        free(vFrameCis);
      }
      return pVVar4;
    }
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d6,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  __assert_fail("pCex->nRegs == Saig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0x1d5,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinComputeReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, int fPiReason )
{
    Vec_Vec_t * vFrameCis, * vFramePPs, * vFrameReas;
    // sanity checks
    assert( pCex->nPis == Saig_ManPiNum(pAig) );
    assert( pCex->nRegs == Saig_ManRegNum(pAig) );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );
    // derive frame terms
    vFrameCis = Saig_ManCexMinCollectFrameTerms( pAig, pCex );
    // derive phase and priority
    vFramePPs = Saig_ManCexMinCollectPhasePriority( pAig, pCex, vFrameCis );
    // derive reasons for property failure
    vFrameReas = Saig_ManCexMinCollectReason( pAig, pCex, vFrameCis, vFramePPs, fPiReason );
    Vec_VecFree( vFramePPs );
    Vec_VecFree( vFrameCis );
    return vFrameReas;
}